

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  cTValue *nextframe;
  BCPos BVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  cTValue *pcVar5;
  BCReg slot;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  if ((cTValue *)(ulong)(L->stack).ptr32 < frame) {
    lVar7 = 0;
    if (((frame->field_2).it & 7) == 3) {
      lVar7 = -((long)(int)(frame->field_2).it & 0xfffffffffffffff8U);
    }
    nextframe = (cTValue *)((long)frame + lVar7);
    uVar4 = *(uint *)((long)frame + lVar7 + 4);
    if (((long)(int)uVar4 & 3U) == 0) {
      pcVar5 = nextframe + (-1 - (ulong)*(byte *)((ulong)uVar4 - 3));
    }
    else {
      pcVar5 = (cTValue *)((long)nextframe - ((long)(int)uVar4 & 0xfffffffffffffff8U));
    }
    uVar4 = (pcVar5->u32).lo;
    BVar1 = debug_framepc(L,(GCfunc *)(ulong)uVar4,nextframe);
    if (BVar1 != 0xffffffff) {
      uVar8 = (ulong)(((GCfunc *)(ulong)uVar4)->c).pc.ptr32;
      uVar4 = *(uint *)(uVar8 + (ulong)BVar1 * 4);
      uVar2 = uVar4 & 0xff;
      uVar6 = (uint)(lj_bc_mode[uVar2] >> 0xb);
      if (uVar6 != 0x16) {
        if (uVar6 != 9) {
          *name = (char *)((ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x198 + (ulong)uVar6 * 4) +
                          0x10);
          return "metamethod";
        }
        uVar4 = uVar4 >> 8 & 0xff;
        slot = uVar4 - 3;
        if (uVar2 != 0x45) {
          slot = uVar4;
        }
        pcVar3 = lj_debug_slotname((GCproto *)(uVar8 - 0x40),(BCIns *)(uVar8 + (ulong)BVar1 * 4),
                                   slot,name);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}